

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

bool __thiscall LowererMD::GenerateFastAdd(LowererMD *this,Instr *instrAdd)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  int iVar4;
  undefined4 *puVar5;
  LabelInstr *labelFail;
  Opnd *pOVar6;
  RegOpnd *dstOpnd;
  Instr *pIVar7;
  IntConstOpnd *src2Opnd;
  BranchInstr *pBVar8;
  LabelInstr *branchTarget;
  Func **ppFVar9;
  Opnd *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  Func **local_38;
  
  pOVar6 = instrAdd->m_src1;
  this_00 = instrAdd->m_src2;
  if (pOVar6 == (Opnd *)0x0 || this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xbea,"(opndSrc1 && opndSrc2)","Expected 2 src opnd\'s on Add instruction");
    if (!bVar2) goto LAB_00655acc;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(pOVar6);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(pOVar6);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_00655acc;
      *puVar5 = 0;
    }
    bVar2 = IR::Opnd::IsNotInt(pOVar6);
    if (bVar2) {
      return false;
    }
    local_3e = (pOVar6->m_valueType).field_0;
    bVar2 = ValueType::IsString((ValueType *)&local_3e.field_0);
    if (bVar2) {
      return false;
    }
    if (instrAdd->m_opcode != Incr_A) {
      local_3c = (pOVar6->m_valueType).field_0;
      bVar2 = ValueType::IsLikelyString((ValueType *)&local_3c.field_0);
      if (bVar2) {
        return false;
      }
    }
  }
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_00655acc;
      *puVar5 = 0;
    }
    bVar2 = IR::Opnd::IsNotInt(this_00);
    if (bVar2) {
      return false;
    }
    local_3a = (this_00->m_valueType).field_0;
    bVar2 = ValueType::IsLikelyString((ValueType *)&local_3a.field_0);
    if (bVar2) {
      return false;
    }
  }
  bVar2 = IR::Opnd::IsTaggedInt(pOVar6);
  if (bVar2) {
    bVar2 = IR::Opnd::IsTaggedInt(this_00);
    local_38 = &this->m_func;
    labelFail = IR::LabelInstr::New(Label,this->m_func,true);
    if (!bVar2) goto LAB_00655864;
  }
  else {
    local_38 = &this->m_func;
    labelFail = IR::LabelInstr::New(Label,this->m_func,true);
LAB_00655864:
    GenerateSmIntPairTest(this,instrAdd,pOVar6,this_00,labelFail);
  }
  OVar3 = IR::Opnd::GetKind(pOVar6);
  ppFVar9 = local_38;
  this_01 = this_00;
  if (OVar3 == OpndKindAddr) {
    this_01 = pOVar6;
    pOVar6 = this_00;
  }
  pOVar6 = IR::Opnd::UseWithNewType(pOVar6,TyInt32,*local_38);
  dstOpnd = IR::RegOpnd::New(TyInt32,*ppFVar9);
  pIVar7 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,pOVar6,*ppFVar9);
  IR::Instr::InsertBefore(instrAdd,pIVar7);
  OVar3 = IR::Opnd::GetKind(this_01);
  if (OVar3 == OpndKindAddr) {
    OVar3 = IR::Opnd::GetKind(this_01);
    if (OVar3 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar2) {
LAB_00655acc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    ppFVar9 = local_38;
    iVar4 = (int)this_01[2]._vptr_Opnd;
    if (iVar4 == 1) {
      pIVar7 = IR::Instr::New(INC,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,*local_38);
    }
    else {
      src2Opnd = IR::IntConstOpnd::New((long)iVar4,TyInt32,*local_38,false);
      pIVar7 = IR::Instr::New(ADD,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&src2Opnd->super_Opnd,
                              *ppFVar9);
    }
  }
  else {
    pOVar6 = IR::Opnd::UseWithNewType(this_01,TyInt32,*ppFVar9);
    pIVar7 = IR::Instr::New(ADD,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,pOVar6,*ppFVar9);
  }
  IR::Instr::InsertBefore(instrAdd,pIVar7);
  Legalize<false>(pIVar7,false);
  pBVar8 = IR::BranchInstr::New(JO,labelFail,*ppFVar9);
  IR::Instr::InsertBefore(instrAdd,&pBVar8->super_Instr);
  if ((dstOpnd->super_Opnd).m_type != TyInt64) {
    dstOpnd = (RegOpnd *)IR::Opnd::UseWithNewType(&dstOpnd->super_Opnd,TyUint64,*ppFVar9);
  }
  GenerateInt32ToVarConversion(this,&dstOpnd->super_Opnd,instrAdd);
  pIVar7 = IR::Instr::New(MOV,instrAdd->m_dst,&dstOpnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instrAdd,pIVar7);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  pBVar8 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrAdd,&pBVar8->super_Instr);
  IR::Instr::InsertBefore(instrAdd,&labelFail->super_Instr);
  IR::Instr::InsertAfter(instrAdd,&branchTarget->super_Instr);
  return true;
}

Assistant:

bool
LowererMD::GenerateFastAdd(IR::Instr * instrAdd)
{
    // Given:
    //
    // dst = Add src1, src2
    //
    // Generate:
    //
    // (If not 2 Int31's, jump to $helper.)
    // s1 = MOV src1
    // s1 = DEC s1          -- Get rid of one of the tag [Int31 only]
    // s1 = ADD s1, src2    -- try an inline add
    //      JO $helper      -- bail if the add overflowed
    // s1 = OR s1, AtomTag_IntPtr                        [Int32 only]
    // dst = MOV s1
    //      JMP $fallthru
    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    IR::Instr *      instr;
    IR::LabelInstr * labelHelper;
    IR::LabelInstr * labelFallThru;
    IR::Opnd *       opndReg;
    IR::Opnd *       opndSrc1;
    IR::Opnd *       opndSrc2;

    opndSrc1 = instrAdd->GetSrc1();
    opndSrc2 = instrAdd->GetSrc2();
    AssertMsg(opndSrc1 && opndSrc2, "Expected 2 src opnd's on Add instruction");

    // Generate fastpath for Incr_A anyway -
    // Incrementing strings representing integers can be inter-mixed with integers e.g. "1"++ -> converts 1 to an int and thereafter, integer increment is expected.
    if (opndSrc1->IsRegOpnd() && (opndSrc1->AsRegOpnd()->IsNotInt() || opndSrc1->GetValueType().IsString()
        || (instrAdd->m_opcode != Js::OpCode::Incr_A && opndSrc1->GetValueType().IsLikelyString())))
    {
        return false;
    }

    if (opndSrc2->IsRegOpnd() && (opndSrc2->AsRegOpnd()->IsNotInt() ||
        opndSrc2->GetValueType().IsLikelyString()))
    {
        return false;
    }

    // Tagged ints?
    bool isTaggedInts = false;
    if (opndSrc1->IsTaggedInt())
    {
        if (opndSrc2->IsTaggedInt())
        {
            isTaggedInts = true;
        }
    }

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!isTaggedInts)
    {
        // (If not 2 Int31's, jump to $helper.)

        this->GenerateSmIntPairTest(instrAdd, opndSrc1, opndSrc2, labelHelper);
    }

    if (opndSrc1->IsAddrOpnd())
    {
        // If opnd1 is a constant, just swap them.
        IR::Opnd *opndTmp = opndSrc1;
        opndSrc1 = opndSrc2;
        opndSrc2 = opndTmp;
    }

    //
    // For 32 bit arithmetic we copy them and set the size of operands to be 32 bits. This is
    // relevant only on AMD64.
    //

    opndSrc1    = opndSrc1->UseWithNewType(TyInt32, this->m_func);

    // s1 = MOV src1

    opndReg = IR::RegOpnd::New(TyInt32, this->m_func);
    instr = IR::Instr::New(Js::OpCode::MOV, opndReg, opndSrc1, this->m_func);
    instrAdd->InsertBefore(instr);

#if !INT32VAR
    // Do the DEC in place
    if (opndSrc2->IsAddrOpnd())
    {
        Assert(opndSrc2->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindConstantVar);
        opndSrc2 = IR::IntConstOpnd::New(*((int *)&(opndSrc2->AsAddrOpnd()->m_address)) - 1, TyInt32, this->m_func, opndSrc2->AsAddrOpnd()->m_dontEncode);
        opndSrc2 = opndSrc2->Use(this->m_func);
    }
    else if (opndSrc2->IsIntConstOpnd())
    {
        Assert(opndSrc2->GetType() == TyInt32);
        opndSrc2 = opndSrc2->Use(this->m_func);
        opndSrc2->AsIntConstOpnd()->DecrValue(1);
    }
    else
    {
        // s1 = DEC s1
        opndSrc2 = opndSrc2->UseWithNewType(TyInt32, this->m_func);
        instr = IR::Instr::New(Js::OpCode::DEC, opndReg, opndReg, this->m_func);
        instrAdd->InsertBefore(instr);
    }

    instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2, this->m_func);
#else
    if (opndSrc2->IsAddrOpnd())
    {
        // truncate to untag
        int value = ::Math::PointerCastToIntegralTruncate<int>(opndSrc2->AsAddrOpnd()->m_address);
        if (value == 1)
        {
            instr = IR::Instr::New(Js::OpCode::INC, opndReg, opndReg, this->m_func);
        }
        else
        {
            opndSrc2 = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
            instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2, this->m_func);
        }
    }
    else
    {
        instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2->UseWithNewType(TyInt32, this->m_func), this->m_func);
    }
#endif

    // s1 = ADD s1, src2
    instrAdd->InsertBefore(instr);
    Legalize(instr);

    //      JO $helper

    instr = IR::BranchInstr::New(Js::OpCode::JO, labelHelper, this->m_func);
    instrAdd->InsertBefore(instr);

    //
    // Convert TyInt32 operand, back to TyMachPtr type.
    //

    if(TyMachReg != opndReg->GetType())
    {
        opndReg = opndReg->UseWithNewType(TyMachPtr, this->m_func);
    }

#if INT32VAR
    // s1 = OR s1, AtomTag_IntPtr
    GenerateInt32ToVarConversion(opndReg, instrAdd);
#endif

    // dst = MOV s1

    instr = IR::Instr::New(Js::OpCode::MOV, instrAdd->GetDst(), opndReg, this->m_func);
    instrAdd->InsertBefore(instr);

    //      JMP $fallthru

    labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(Js::OpCode::JMP, labelFallThru, this->m_func);
    instrAdd->InsertBefore(instr);

    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    instrAdd->InsertBefore(labelHelper);
    instrAdd->InsertAfter(labelFallThru);

    return true;
}